

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O0

void __thiscall
xray_re::xr_mesh_vbuf::push(xr_mesh_vbuf *this,xr_vbuf *vb,xr_ibuf *ib,fmatrix *xform)

{
  ushort uVar1;
  fvector3 *pfVar2;
  fvector2 *pfVar3;
  finfluence *pfVar4;
  fcolor *pfVar5;
  bool bVar6;
  uint32_t uVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  uint16_t *puVar11;
  fvector3 *p0;
  fvector3 *p1;
  fvector3 *p2;
  xr_vbuf *source;
  undefined4 extraout_var;
  xr_vbuf *reserved;
  void *extraout_RDX;
  size_t local_70;
  size_t n;
  fvector2 *uv;
  fvector3 normal;
  uint32_t v2;
  uint32_t v1;
  uint32_t v0;
  size_t num_indices;
  size_t i;
  fvector3 *normals;
  size_t new_size;
  fmatrix *xform_local;
  xr_ibuf *ib_local;
  xr_vbuf *vb_local;
  xr_mesh_vbuf *this_local;
  
  source = vb;
  uVar7 = xr_vbuf::signature(&this->super_xr_vbuf);
  if (uVar7 == 0) {
    sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
    if (sVar9 != 0) {
      __assert_fail("size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x43,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    uVar7 = xr_vbuf::signature(vb);
    source = (xr_vbuf *)(ulong)uVar7;
    set_signature(this,uVar7);
  }
  sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
  sVar10 = xr_flexbuf::size(&vb->super_xr_flexbuf);
  reserved = (xr_vbuf *)(sVar9 + sVar10);
  if ((xr_vbuf *)this->m_reserved < reserved) {
    source = reserved;
    reserve(this,(size_t)reserved);
  }
  bVar6 = xr_vbuf::has_points(&this->super_xr_vbuf);
  if (bVar6) {
    bVar6 = xr_vbuf::has_points(vb);
    if (!bVar6) {
      __assert_fail("vb.has_points()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x4a,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    if (xform == (fmatrix *)0x0) {
      source = (xr_vbuf *)xr_vbuf::p(vb);
      pfVar2 = (this->super_xr_vbuf).m_points;
      sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
      sVar10 = xr_flexbuf::size(&vb->super_xr_flexbuf);
      xr_flexbuf::copy<xray_re::_vector3<float>>
                ((xr_flexbuf *)this,(_vector3<float> *)source,pfVar2 + sVar9,sVar10);
    }
    else {
      source = (xr_vbuf *)xr_vbuf::p(vb);
      pfVar2 = (this->super_xr_vbuf).m_points;
      sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
      sVar10 = xr_flexbuf::size(&vb->super_xr_flexbuf);
      transform_points(this,(fvector3 *)source,pfVar2 + sVar9,sVar10,xform);
    }
  }
  bVar6 = xr_vbuf::has_normals(&this->super_xr_vbuf);
  if (bVar6) {
    bVar6 = xr_vbuf::has_normals(vb);
    if (bVar6) {
      source = (xr_vbuf *)xr_vbuf::n(vb);
      pfVar2 = (this->super_xr_vbuf).m_normals;
      sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
      sVar10 = xr_flexbuf::size(&vb->super_xr_flexbuf);
      xr_flexbuf::copy<xray_re::_vector3<float>>
                ((xr_flexbuf *)this,(_vector3<float> *)source,pfVar2 + sVar9,sVar10);
    }
    else {
      if (ib == (xr_ibuf *)0x0) {
        __assert_fail("ib",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                      ,0x59,
                      "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                     );
      }
      pfVar2 = (this->super_xr_vbuf).m_normals;
      sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
      num_indices = 0;
      sVar10 = xr_flexbuf::size(&ib->super_xr_flexbuf);
      for (; num_indices < sVar10; num_indices = num_indices + 3) {
        puVar11 = xr_ibuf::operator[](ib,num_indices);
        uVar1 = *puVar11;
        puVar11 = xr_ibuf::operator[](ib,num_indices + 1);
        normal.field_0.field_0.z = (float)(uint)*puVar11;
        puVar11 = xr_ibuf::operator[](ib,num_indices + 2);
        normal.field_0.field_0.y = (float)(uint)*puVar11;
        p0 = xr_vbuf::p(vb,(ulong)(uint)uVar1);
        p1 = xr_vbuf::p(vb,(ulong)(uint)normal.field_0.field_0.z);
        p2 = xr_vbuf::p(vb,(ulong)(uint)normal.field_0.field_0.y);
        _vector3<float>::calc_normal((_vector3<float> *)&uv,p0,p1,p2);
        _vector3<float>::set<float>(pfVar2 + sVar9 + (uint)uVar1,(_vector3<float> *)&uv);
        _vector3<float>::set<float>
                  (pfVar2 + sVar9 + (uint)normal.field_0.field_0.z,(_vector3<float> *)&uv);
        source = (xr_vbuf *)&uv;
        _vector3<float>::set<float>
                  (pfVar2 + sVar9 + (uint)normal.field_0.field_0.y,(_vector3<float> *)source);
      }
    }
  }
  bVar6 = xr_vbuf::has_texcoords(&this->super_xr_vbuf);
  if (bVar6) {
    bVar6 = xr_vbuf::has_texcoords(vb);
    if (!bVar6) {
      __assert_fail("vb.has_texcoords()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x68,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    source = (xr_vbuf *)xr_vbuf::tc(vb);
    pfVar3 = (this->super_xr_vbuf).m_texcoords;
    sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
    sVar10 = xr_flexbuf::size(&vb->super_xr_flexbuf);
    xr_flexbuf::copy<xray_re::_vector2<float>>
              ((xr_flexbuf *)this,(_vector2<float> *)source,pfVar3 + sVar9,sVar10);
    if ((this->m_tc_fix & 1U) != 0) {
      pfVar3 = (this->super_xr_vbuf).m_texcoords;
      sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
      n = (size_t)(pfVar3 + sVar9);
      for (local_70 = xr_flexbuf::size(&vb->super_xr_flexbuf); local_70 != 0;
          local_70 = local_70 - 1) {
        _vector2<float>::mul((_vector2<float> *)n,0.5);
        n = n + 8;
      }
    }
  }
  bVar6 = xr_vbuf::has_influences(&this->super_xr_vbuf);
  if (bVar6) {
    bVar6 = xr_vbuf::has_influences(vb);
    if (!bVar6) {
      __assert_fail("vb.has_influences()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x72,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    source = (xr_vbuf *)xr_vbuf::w(vb);
    pfVar4 = (this->super_xr_vbuf).m_influences;
    sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
    sVar10 = xr_flexbuf::size(&vb->super_xr_flexbuf);
    xr_flexbuf::copy<xray_re::_influence<unsigned_int,float>>
              ((xr_flexbuf *)this,(_influence<unsigned_int,_float> *)source,pfVar4 + sVar9,sVar10);
  }
  bVar6 = xr_vbuf::has_colors(&this->super_xr_vbuf);
  if (bVar6) {
    bVar6 = xr_vbuf::has_colors(vb);
    if (!bVar6) {
      __assert_fail("vb.has_colors()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x76,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    iVar8 = xr_vbuf::c(vb,source,extraout_RDX);
    pfVar5 = (this->super_xr_vbuf).m_colors;
    sVar9 = xr_flexbuf::size((xr_flexbuf *)this);
    sVar10 = xr_flexbuf::size(&vb->super_xr_flexbuf);
    xr_flexbuf::copy<xray_re::_color<float>>
              ((xr_flexbuf *)this,(_color<float> *)CONCAT44(extraout_var,iVar8),pfVar5 + sVar9,
               sVar10);
  }
  xr_flexbuf::set_size((xr_flexbuf *)this,(size_t)reserved);
  return;
}

Assistant:

void xr_mesh_vbuf::push(const xr_vbuf& vb, const xr_ibuf* ib, const fmatrix* xform)
{
	if (signature() == 0) {
		xr_assert(size() == 0);
		set_signature(vb.signature());
	}
	size_t new_size = size() + vb.size();
	if (m_reserved < new_size)
		reserve(new_size);
	if (has_points()) {
		xr_assert(vb.has_points());
		if (xform)
			transform_points(vb.p(), m_points + size(), vb.size(), *xform);
		else
			copy(vb.p(), m_points + size(), vb.size());
	}
	if (has_normals()) {
		if (vb.has_normals()) {
			if (false && xform)
				transform_normals(vb.n(), m_normals + size(), vb.size(), *xform);
			else
				copy(vb.n(), m_normals + size(), vb.size());
		} else {
			// generate fake normals for 1xxx builds.
			// FIXME (maybe): this will not work correctly for the duplicate faces.
			xr_assert(ib);
			fvector3* normals = m_normals + size();
			for (size_t i = 0, num_indices = ib->size(); i < num_indices; i += 3) {
				uint32_t v0 = (*ib)[i + 0];
				uint32_t v1 = (*ib)[i + 1];
				uint32_t v2 = (*ib)[i + 2];
				fvector3 normal;
				normal.calc_normal(vb.p(v0), vb.p(v1), vb.p(v2));
				normals[v0].set(normal);
				normals[v1].set(normal);
				normals[v2].set(normal);
			}
		}
	}
	if (has_texcoords()) {
		xr_assert(vb.has_texcoords());
		copy(vb.tc(), m_texcoords + size(), vb.size());
		if (m_tc_fix) {
			fvector2* uv = m_texcoords + size();
			for (size_t n = vb.size(); n != 0; --n, ++uv)
				uv->mul(0.5f);
		}
	}
	// intentionally ignoring lightmaps here
	if (has_influences()) {
		xr_assert(vb.has_influences());
		copy(vb.w(), m_influences + size(), vb.size());
	}
	if (has_colors()) {
		xr_assert(vb.has_colors());
		copy(vb.c(), m_colors + size(), vb.size());
	}
	set_size(new_size);
}